

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

int __thiscall
PenguinV_Image::ImageTemplate<short>::copy
          (ImageTemplate<short> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  short *psVar5;
  int iVar6;
  FunctionFacade *pFVar7;
  _func_short_ptr_unsigned_long *p_Var8;
  short *psVar9;
  _func_void_short_ptr_short_ptr_unsigned_long *UNRECOVERED_JUMPTABLE;
  imageException *this_00;
  
  if ((EVP_PKEY_CTX)this->_type != dst[0x20]) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Cannot copy image of one type to another type.");
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  clear(this);
  uVar4 = *(undefined8 *)(dst + 8);
  this->_width = (int)uVar4;
  this->_height = (int)((ulong)uVar4 >> 0x20);
  this->_colorCount = (uint8_t)dst[0x10];
  uVar1 = *(uint32_t *)(dst + 0x14);
  this->_rowSize = uVar1;
  this->_alignment = (uint8_t)dst[0x11];
  if (*(long *)(dst + 0x18) != 0) {
    pFVar7 = FunctionFacade::instance();
    p_Var8 = __PenguinV_Image__ImageTemplate<short>__FunctionFacade___getFunction<short*(*)(unsigned_long)>_std__vector<short*(*)(unsigned_long),std::allocator<short*(*)(unsigned_long)>>const__unsigned_char_const_
                       (pFVar7,&pFVar7->_allocate,this->_type);
    psVar9 = (*p_Var8)((long)uVar1 * (long)((ulong)uVar4 >> 0x20));
    this->_data = psVar9;
    psVar5 = *(short **)(dst + 0x18);
    uVar2 = this->_height;
    uVar3 = this->_rowSize;
    pFVar7 = FunctionFacade::instance();
    UNRECOVERED_JUMPTABLE =
         __PenguinV_Image__ImageTemplate<short>__FunctionFacade___getFunction<void(*)(short*,short*,unsigned_long)>_std__vector<void(*)(short*,short*,unsigned_long),std::allocator<void(*)(short*,short*,unsigned_long)>>const__unsigned_char_const_
                   (pFVar7,&pFVar7->_copy,this->_type);
    iVar6 = (*UNRECOVERED_JUMPTABLE)(psVar9,psVar5,(ulong)uVar3 * (ulong)uVar2 * 2);
    return iVar6;
  }
  return (int)uVar4;
}

Assistant:

void copy( const ImageTemplate & image )
        {
            if( _type != image._type )
                throw imageException( "Cannot copy image of one type to another type." );

            clear();

            _width  = image._width;
            _height = image._height;

            _colorCount = image._colorCount;
            _rowSize    = image._rowSize;
            _alignment  = image._alignment;

            if( image._data != nullptr ) {
                _data = _allocate( _height * _rowSize );

                _copy( _data, image._data, sizeof( TColorDepth ) * _height * _rowSize );
            }
        }